

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i8255.hpp
# Opt level: O0

ssize_t __thiscall
Intel::i8255::i8255<AmstradCPC::i8255PortHandler>::read
          (i8255<AmstradCPC::i8255PortHandler> *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  undefined7 extraout_var;
  ulong uVar4;
  undefined7 extraout_var_00;
  byte local_32;
  byte local_31;
  uint8_t input;
  int address_local;
  i8255<AmstradCPC::i8255PortHandler> *this_local;
  undefined7 uVar5;
  
  uVar3 = __fd & 3;
  uVar4 = (ulong)(uVar3 - 3);
  if (uVar3 < 3 || uVar3 - 3 == 0) {
    uVar5 = (undefined7)((ulong)this >> 8);
    switch(uVar3) {
    case 0:
      if ((this->control_ & 0x10) == 0) {
        local_31 = this->outputs_[0];
      }
      else {
        local_31 = AmstradCPC::i8255PortHandler::get_value(this->port_handler_,0);
        uVar5 = extraout_var;
      }
      uVar4 = CONCAT71(uVar5,local_31);
      this_local._7_1_ = local_31;
      break;
    case 1:
      if ((this->control_ & 2) == 0) {
        local_32 = this->outputs_[1];
      }
      else {
        local_32 = AmstradCPC::i8255PortHandler::get_value(this->port_handler_,1);
        uVar5 = extraout_var_00;
      }
      uVar4 = CONCAT71(uVar5,local_32);
      this_local._7_1_ = local_32;
      break;
    case 2:
      if ((this->control_ & 9) == 0) {
        this_local._7_1_ = this->outputs_[2];
        uVar4 = CONCAT71(uVar5,this_local._7_1_);
      }
      else {
        bVar2 = AmstradCPC::i8255PortHandler::get_value(this->port_handler_,2);
        bVar1 = bVar2;
        if ((this->control_ & 1) == 0) {
          bVar1 = this->outputs_[2];
        }
        if ((this->control_ & 8) == 0) {
          bVar2 = this->outputs_[2];
        }
        this_local._7_1_ = bVar1 & 0xf | bVar2 & 0xf0;
        uVar4 = 0;
      }
      break;
    case 3:
      this_local._7_1_ = this->control_;
      uVar4 = CONCAT71(uVar5,this_local._7_1_);
    }
  }
  else {
    this_local._7_1_ = 0xff;
  }
  return CONCAT71((int7)(uVar4 >> 8),this_local._7_1_);
}

Assistant:

uint8_t read(int address) {
			switch(address & 3) {
				case 0:	return (control_ & 0x10) ? port_handler_.get_value(0) : outputs_[0];
				case 1:	return (control_ & 0x02) ? port_handler_.get_value(1) : outputs_[1];
				case 2:	{
					if(!(control_ & 0x09)) return outputs_[2];
					uint8_t input = port_handler_.get_value(2);
					return ((control_ & 0x01) ? (input & 0x0f) : (outputs_[2] & 0x0f)) | ((control_ & 0x08) ? (input & 0xf0) : (outputs_[2] & 0xf0));
				}
				case 3:	return control_;
			}
			return 0xff;
		}